

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  int iVar3;
  bool bVar4;
  string *psVar5;
  bool bVar6;
  char **ppcVar7;
  stat st;
  Options local_ec;
  allocator local_e9;
  string local_e8;
  ulong local_c8;
  stat local_c0;
  
  local_c8 = 0;
  bVar6 = false;
  bVar4 = false;
  do {
    while( true ) {
      do {
        iVar3 = argc;
        uVar2 = getopt_long(argc,argv,"xjv",main::longOpts,0);
        iVar1 = (int)uVar2;
      } while (iVar1 == 0);
      if (iVar1 < 0x76) break;
      if (iVar1 == 0x76) {
        bVar4 = true;
      }
      else {
        if (iVar1 != 0x78) {
          if (iVar1 == 0x1337) {
            usage(iVar3,argv);
          }
LAB_00112361:
          exit(1);
        }
        bVar6 = true;
      }
    }
    if (iVar1 == -1) {
      local_ec.json = SUB81(local_c8,0);
      if (argc <= _optind) {
        return 0;
      }
      ppcVar7 = argv + _optind;
      iVar3 = argc - _optind;
      local_ec.extract = bVar6;
      local_ec.verbose = bVar4;
      break;
    }
    if (iVar1 != 0x6a) goto LAB_00112361;
    local_c8 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
  } while( true );
LAB_00112280:
  iVar1 = stat(*ppcVar7,&local_c0);
  if (iVar1 < 0) {
    main_cold_1();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (bVar6 == false) {
    if ((local_c8 & 1) != 0) {
      psVar5 = &local_e8;
      std::__cxx11::string::string((string *)&local_e8,*ppcVar7,&local_e9);
      json((Options *)psVar5,&local_e8);
      goto LAB_001122d0;
    }
    std::__cxx11::string::string((string *)&local_e8,*ppcVar7,&local_e9);
    iVar1 = dump(&local_ec,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    psVar5 = &local_e8;
    std::__cxx11::string::string((string *)&local_e8,*ppcVar7,&local_e9);
    extract((Options *)psVar5,&local_e8);
LAB_001122d0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  ppcVar7 = ppcVar7 + 1;
  iVar3 = iVar3 + -1;
  if (iVar3 == 0) {
    return 0;
  }
  goto LAB_00112280;
}

Assistant:

int main(int argc, char** argv) {
  Options opts;

  while (1) {
    static struct option longOpts[] = {
      {"extract", no_argument, nullptr, 'x'},
      {"json",    no_argument, nullptr, 'j'},
      {"verbose", no_argument, nullptr, 'v'},
      {"help",    no_argument, nullptr, 0x1337},
      {nullptr,   0,           nullptr, 0},
    };

    auto c = getopt_long(argc, argv, "xjv", longOpts, nullptr);
    if (c == -1) {
      break;
    }

    switch (c) {
    case 0:
      break;
    case 'x':
      opts.extract = true;
      break;
    case 'j':
      opts.json = true;
      break;
    case 'v':
      opts.verbose = true;
      break;
    case 0x1337:
      usage(argc, argv);
      break;
    default:
      exit(1);
    }
  }

  for (auto i = optind; i < argc; i++) {
    struct stat st;
    auto rv = stat(argv[i], &st);
    if (rv < 0) {
      fprintf(stderr, "%s: %s\n", argv[i], strerror(errno));
      exit(1);
    }
    if (opts.extract) {
      rv = extract(opts, argv[i]);
      if (rv != 0) {
        return rv;
      }
    } else {
      if (opts.json) {
        rv = json(opts, argv[i]);
        if (rv != 0) {
          return rv;
        }
        continue;
      }
      rv = dump(opts, argv[i]);
      if (rv != 0) {
        return rv;
      }
    }
  }

  return 0;
}